

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_signal_add_(event_base *base,int sig,event *ev)

{
  eventop *peVar1;
  event **ppeVar2;
  event *peVar3;
  int iVar4;
  event_signal_map *map_00;
  void *pvVar5;
  evmap_signal *ctx;
  event_signal_map *map;
  eventop *evsel;
  event *ev_local;
  int sig_local;
  event_base *base_local;
  
  peVar1 = base->evsigsel;
  map_00 = &base->sigmap;
  if ((sig < 0) || (0x40 < sig)) {
    base_local._4_4_ = -1;
  }
  else if ((sig < (base->sigmap).nentries) || (iVar4 = evmap_make_space(map_00,sig,8), iVar4 != -1))
  {
    if (map_00->entries[sig] == (void *)0x0) {
      pvVar5 = event_mm_calloc_(1,base->evsigsel->fdinfo_len + 8);
      map_00->entries[sig] = pvVar5;
      if (map_00->entries[sig] == (void *)0x0) {
        return -1;
      }
      evmap_signal_init((evmap_signal *)map_00->entries[sig]);
    }
    ppeVar2 = (event **)map_00->entries[sig];
    if ((*ppeVar2 == (event *)0x0) &&
       (iVar4 = (*peVar1->add)(base,ev->ev_fd,0,8,(void *)0x0), iVar4 == -1)) {
      base_local._4_4_ = -1;
    }
    else {
      peVar3 = *ppeVar2;
      (ev->ev_).ev_io.ev_io_next.le_next = peVar3;
      if (peVar3 != (event *)0x0) {
        ((*ppeVar2)->ev_).ev_io.ev_io_next.le_prev = (event **)&ev->ev_;
      }
      *ppeVar2 = ev;
      (ev->ev_).ev_io.ev_io_next.le_prev = ppeVar2;
      base_local._4_4_ = 1;
    }
  }
  else {
    base_local._4_4_ = -1;
  }
  return base_local._4_4_;
}

Assistant:

int
evmap_signal_add_(struct event_base *base, int sig, struct event *ev)
{
	const struct eventop *evsel = base->evsigsel;
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx = NULL;

	if (sig < 0 || sig >= NSIG)
		return (-1);

	if (sig >= map->nentries) {
		if (evmap_make_space(
			map, sig, sizeof(struct evmap_signal *)) == -1)
			return (-1);
	}
	GET_SIGNAL_SLOT_AND_CTOR(ctx, map, sig, evmap_signal, evmap_signal_init,
	    base->evsigsel->fdinfo_len);

	if (LIST_EMPTY(&ctx->events)) {
		if (evsel->add(base, ev->ev_fd, 0, EV_SIGNAL, NULL)
		    == -1)
			return (-1);
	}

	LIST_INSERT_HEAD(&ctx->events, ev, ev_signal_next);

	return (1);
}